

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variance_test.cc
# Opt level: O0

void __thiscall
anon_unknown.dwarf_151d8d0::
MainTestClass<void_(*)(const_unsigned_char_*,_int,_const_unsigned_char_*,_int,_unsigned_int_*,_unsigned_int_*,_int_*,_unsigned_int_*)>
::TearDown(MainTestClass<void_(*)(const_unsigned_char_*,_int,_const_unsigned_char_*,_int,_unsigned_int_*,_unsigned_int_*,_int_*,_unsigned_int_*)>
           *this)

{
  bool bVar1;
  MainTestClass<void_(*)(const_unsigned_char_*,_int,_const_unsigned_char_*,_int,_unsigned_int_*,_unsigned_int_*,_int_*,_unsigned_int_*)>
  *in_RDI;
  
  bVar1 = use_high_bit_depth(in_RDI);
  if (bVar1) {
    in_RDI->src_ = (uint8_t *)((long)in_RDI->src_ << 1);
    in_RDI->ref_ = (uint8_t *)((long)in_RDI->ref_ << 1);
  }
  aom_free(in_RDI);
  if (in_RDI->ref_ != (uint8_t *)0x0) {
    operator_delete__(in_RDI->ref_);
  }
  in_RDI->src_ = (uint8_t *)0x0;
  in_RDI->ref_ = (uint8_t *)0x0;
  return;
}

Assistant:

void TearDown() override {
    if (use_high_bit_depth()) {
      // TODO(skal): remove!
      src_ = reinterpret_cast<uint8_t *>(CONVERT_TO_SHORTPTR(src_));
      ref_ = reinterpret_cast<uint8_t *>(CONVERT_TO_SHORTPTR(ref_));
    }

    aom_free(src_);
    delete[] ref_;
    src_ = nullptr;
    ref_ = nullptr;
  }